

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O1

void stbi_decode_DXT1_block(uchar *uncompressed,uchar *compressed)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uchar local_38 [7];
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined4 local_2c;
  
  uVar1 = *(ushort *)(compressed + 2);
  iVar2 = (uint)(compressed[1] >> 3) * 0xff;
  uVar8 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (*(ushort *)compressed >> 5 & 0x3f) * 0xff;
  uVar4 = (iVar2 + 0x20U >> 6) + iVar2 + 0x20 >> 6;
  iVar2 = (*compressed & 0x1f) * 0xff;
  uVar3 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  local_38[0] = (uchar)uVar8;
  local_38[1] = (char)uVar4;
  local_38[2] = (char)uVar3;
  local_38[3] = 0xff;
  iVar2 = (uint)(compressed[3] >> 3) * 0xff;
  uVar6 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (uVar1 >> 5 & 0x3f) * 0xff;
  uVar10 = iVar2 + (iVar2 + 0x20U >> 6) + 0x20 >> 6;
  iVar2 = ((byte)*(ushort *)(compressed + 2) & 0x1f) * 0xff;
  uVar9 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  local_38[4] = (char)uVar6;
  local_38[5] = (char)uVar10;
  local_38[6] = (char)uVar9;
  local_31 = 0xff;
  uVar8 = uVar8 & 0xff;
  if (uVar1 < *(ushort *)compressed) {
    local_30 = (char)(((uVar6 & 0xff) + uVar8 * 2) * 0x5556 >> 0x10);
    local_2f = (char)(((uVar10 & 0xff) + (uVar4 & 0xff) * 2) * 0x5556 >> 0x10);
    local_2e = (char)(((uVar9 & 0xff) + (uVar3 & 0xff) * 2) * 0x5556 >> 0x10);
    local_2d = 0xff;
    local_2c = CONCAT13(0xff,CONCAT12((char)(((uVar3 & 0xff) + (uVar9 & 0xff) * 2) * 0x5556 >> 0x10)
                                      ,CONCAT11((char)(((uVar4 & 0xff) + (uVar10 & 0xff) * 2) *
                                                       0x5556 >> 0x10),
                                                (char)((uVar8 + (uVar6 & 0xff) * 2) * 0x5556 >> 0x10
                                                      ))));
  }
  else {
    local_30 = (char)((uVar6 & 0xff) + uVar8 >> 1);
    local_2f = (char)((uVar10 & 0xff) + (uVar4 & 0xff) >> 1);
    local_2e = (char)((uVar9 & 0xff) + (uVar3 & 0xff) >> 1);
    local_2d = 0xff;
    local_2c = 0;
  }
  uVar3 = 0x20;
  uVar5 = 0xfffffffffffffffc;
  do {
    uVar7 = (ulong)(compressed[uVar3 >> 3] >> ((byte)uVar3 & 6) & 3);
    uVar3 = uVar3 + 2;
    uncompressed[uVar5 + 4] = local_38[uVar7 * 4];
    uncompressed[uVar5 + 5] = local_38[uVar7 * 4 + 1];
    uncompressed[uVar5 + 6] = local_38[uVar7 * 4 + 2];
    uncompressed[uVar5 + 7] = local_38[uVar7 * 4 + 3];
    uVar5 = uVar5 + 4;
  } while (uVar5 < 0x3c);
  return;
}

Assistant:

void stbi_decode_DXT1_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*4];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	decode_colors[3] = 255;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[4] = r;
	decode_colors[5] = g;
	decode_colors[6] = b;
	decode_colors[7] = 255;
	if( c0 > c1 )
	{
		//	no alpha, 2 interpolated colors
		decode_colors[8] = (2*decode_colors[0] + decode_colors[4]) / 3;
		decode_colors[9] = (2*decode_colors[1] + decode_colors[5]) / 3;
		decode_colors[10] = (2*decode_colors[2] + decode_colors[6]) / 3;
		decode_colors[11] = 255;
		decode_colors[12] = (decode_colors[0] + 2*decode_colors[4]) / 3;
		decode_colors[13] = (decode_colors[1] + 2*decode_colors[5]) / 3;
		decode_colors[14] = (decode_colors[2] + 2*decode_colors[6]) / 3;
		decode_colors[15] = 255;
	} else
	{
		//	1 interpolated color, alpha
		decode_colors[8] = (decode_colors[0] + decode_colors[4]) / 2;
		decode_colors[9] = (decode_colors[1] + decode_colors[5]) / 2;
		decode_colors[10] = (decode_colors[2] + decode_colors[6]) / 2;
		decode_colors[11] = 255;
		decode_colors[12] = 0;
		decode_colors[13] = 0;
		decode_colors[14] = 0;
		decode_colors[15] = 0;
	}
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 4;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
		uncompressed[i+3] = decode_colors[idx+3];
	}
	//	done
}